

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O1

size_t rtosc_scan_arg_vals(char *src,rtosc_arg_val_t *args,size_t n,char *buffer_for_strings,
                          size_t bufsize)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  ushort **ppuVar5;
  size_t sVar6;
  size_t args_before;
  int local_6c;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  long local_50;
  ulong local_48;
  rtosc_arg_val_t *local_40;
  char *local_38;
  
  if (n == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    args_before = 0;
    local_60 = bufsize;
    local_58 = n;
    do {
      local_68 = local_60;
      local_38 = buffer_for_strings;
      sVar3 = rtosc_scan_arg_val(src,args,local_58 - args_before,buffer_for_strings,&local_60,
                                 args_before,1);
      src = src + sVar3;
      sVar6 = sVar6 + sVar3;
      local_40 = args;
      iVar2 = next_arg_offset(args);
      local_50 = (long)iVar2;
      local_48 = args_before + local_50;
      local_68 = local_68 - local_60;
      do {
        local_6c = 0;
        __isoc99_sscanf(src," %n",&local_6c);
        lVar4 = (long)local_6c;
        sVar6 = sVar6 + lVar4;
        cVar1 = src[lVar4];
        src = src + lVar4;
        while (cVar1 == '%') {
          local_6c = 0;
          __isoc99_sscanf(src,"%*[^\n]%n",&local_6c);
          lVar4 = (long)local_6c;
          sVar6 = sVar6 + lVar4;
          cVar1 = src[lVar4];
          src = src + lVar4;
        }
        ppuVar5 = __ctype_b_loc();
      } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      args = local_40 + local_50;
      buffer_for_strings = local_38 + local_68;
      args_before = local_48;
    } while (local_48 < local_58);
  }
  return sVar6;
}

Assistant:

size_t rtosc_scan_arg_vals(const char* src,
                           rtosc_arg_val_t *args, size_t n,
                           char* buffer_for_strings, size_t bufsize)
{
    size_t last_bufsize;
    size_t rd=0;
    for(size_t i = 0; i < n; )
    {
        last_bufsize = bufsize;

        size_t tmp = rtosc_scan_arg_val(src, args, n-i,
                                        buffer_for_strings, &bufsize, i, 1);
        src += tmp;
        rd += tmp;
        size_t length = next_arg_offset(args);
        i += length;
        args += length;

        size_t scanned = last_bufsize - bufsize;
        buffer_for_strings += scanned;

        do
        {
            rd += skip_fmt(&src, " %n");
            while(*src == '%')
                rd += skip_fmt(&src, "%*[^\n]%n");
        } while(isspace(*src));
    }
    return rd;
}